

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::OsqpTest_NewConstraintMatrixInTwoDimLP_Test::
~OsqpTest_NewConstraintMatrixInTwoDimLP_Test(OsqpTest_NewConstraintMatrixInTwoDimLP_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, NewConstraintMatrixInTwoDimLP) {
  // Minimize -x subject to:
  // x + y <= 1, x >= 1, y >= 0.

  SparseMatrix<double> constraint_matrix(3, 2);
  const Triplet<double> kTripletsA[] = {
      {0, 0, 1.0}, {0, 1, 1.0}, {1, 0, 1.0}, {2, 1, 1.0}};
  constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                    std::end(kTripletsA));

  OsqpInstance instance;
  instance.objective_matrix = SparseMatrix<double>(2, 2);
  instance.objective_vector.resize(2);
  instance.objective_vector << -1.0, 0.0;
  instance.constraint_matrix = constraint_matrix;
  instance.lower_bounds.resize(3);
  instance.lower_bounds << -kInfinity, 1.0, 0.0;
  instance.upper_bounds.resize(3);
  instance.upper_bounds << 1.0, kInfinity, kInfinity;

  OsqpSolver solver;
  OsqpSettings settings;
  // absolute_convergence_tolerance (eps_abs) is an l_2 tolerance on the
  // residual vector, so this is safe given we use kTolerance
  // as an l_infty tolerance.
  settings.eps_abs = kTolerance;
  settings.eps_rel = 0.0;
  EXPECT_FALSE(solver.IsInitialized());
  ASSERT_TRUE(solver.Init(instance, settings).ok());
  EXPECT_TRUE(solver.IsInitialized());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  double x_exp = 1.0;
  double y_exp = 0.0;

  EXPECT_NEAR(solver.objective_value(), -x_exp, kTolerance);
  ExpectElementsAre(solver.primal_solution(), {x_exp, y_exp}, kTolerance);

  // Change to Minimize -x subject to:
  // 2*x + y <= 1.5, 2*x >= 1, y >= 0.25
  SparseMatrix<double> new_constraint_matrix = constraint_matrix;
  new_constraint_matrix.coeffRef(0, 0) = 2;
  new_constraint_matrix.coeffRef(1, 0) = 2;

  VectorXd new_lower_bounds(3);
  new_lower_bounds << -kInfinity, 1, 0.25;
  VectorXd new_upper_bounds(3);
  new_upper_bounds << 1.5, kInfinity, kInfinity;

  ASSERT_TRUE(solver.SetBounds(new_lower_bounds, new_upper_bounds).ok());

  ASSERT_TRUE(solver.UpdateConstraintMatrix(new_constraint_matrix).ok());
  EXPECT_TRUE(solver.IsInitialized());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  x_exp = 0.624997;
  y_exp = 0.250002;

  EXPECT_NEAR(solver.objective_value(), -x_exp, 2 * kTolerance);
  ExpectElementsAre(solver.primal_solution(), {x_exp, y_exp}, kTolerance);
}